

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

void cleanup_artifact(void)

{
  artifact *paVar1;
  artifact *art;
  wchar_t idx;
  
  for (art._4_4_ = 0; art._4_4_ < (int)(uint)z_info->a_max; art._4_4_ = art._4_4_ + 1) {
    paVar1 = a_info + art._4_4_;
    string_free(paVar1->name);
    string_free(paVar1->alt_msg);
    string_free(paVar1->effect_msg);
    string_free(paVar1->text);
    mem_free(paVar1->brands);
    mem_free(paVar1->slays);
    mem_free(paVar1->curses);
    free_effect(paVar1->effect);
  }
  mem_free(a_info);
  mem_free(aup_info);
  return;
}

Assistant:

static void cleanup_artifact(void)
{
	int idx;
	for (idx = 0; idx < z_info->a_max; idx++) {
		struct artifact *art = &a_info[idx];
		string_free(art->name);
		string_free(art->alt_msg);
		string_free(art->effect_msg);
		string_free(art->text);
		mem_free(art->brands);
		mem_free(art->slays);
		mem_free(art->curses);
		free_effect(art->effect);
	}
	mem_free(a_info);
	mem_free(aup_info);
}